

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O0

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int i_5;
  float norm_var_inv_1;
  float norm_var_1;
  float sqmean_1;
  float *outptr_3;
  int q_7;
  int i_4;
  float *outptr_2;
  int q_6;
  float norm_var_inv;
  float norm_var;
  int q_5;
  float sqmean;
  int i_3;
  float s_1;
  float *ptr_3;
  int q_4;
  Mat sqsum;
  int i_2;
  float mean_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  int q_1;
  float mean;
  int i;
  float s;
  float *ptr;
  int q;
  Mat sum;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  size_t in_stack_fffffffffffffb88;
  int _w;
  Mat *in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  Mat *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  int local_3d8;
  Mat local_3c8;
  float *local_380;
  int local_378;
  int local_374;
  Mat local_370;
  float *local_328;
  int local_31c;
  float local_318;
  float local_314;
  int local_310;
  float local_30c;
  int local_308;
  float local_304;
  Mat local_300;
  float *local_2b8;
  int local_2ac;
  Mat local_2a8;
  int local_260;
  float local_25c;
  Mat local_258;
  float *local_210;
  Mat local_208;
  float *local_1c0;
  int local_1b8;
  int local_1b4;
  Mat local_1b0;
  float *local_168;
  Mat local_160;
  float *local_118;
  int local_10c;
  int local_108;
  float local_104;
  int local_100;
  float local_fc;
  Mat local_f8;
  float *local_b0;
  int local_a4;
  int local_a0;
  Mat local_90;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x38);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  ncnn::Mat::create(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98,
                    (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),in_stack_fffffffffffffb88,
                    (Allocator *)in_stack_fffffffffffffb80);
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb80);
  if (bVar2) {
    return -100;
  }
  ncnn::Mat::Mat(in_stack_fffffffffffffb90,(int)(in_stack_fffffffffffffb88 >> 0x20),
                 (size_t)in_stack_fffffffffffffb80,
                 (Allocator *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb80);
  if (bVar2) {
    local_4 = -100;
    local_a0 = 1;
  }
  else {
    for (local_a4 = 0; local_a4 < local_34; local_a4 = local_a4 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_f8);
      ncnn::Mat::~Mat((Mat *)0x4bc698);
      local_fc = 0.0;
      for (local_100 = 0; fVar1 = local_fc, local_100 < local_44; local_100 = local_100 + 1) {
        local_fc = pfVar3[local_100] + local_fc;
      }
      local_b0 = pfVar3;
      pfVar3 = ncnn::Mat::operator[](&local_90,(long)local_a4);
      *pfVar3 = fVar1;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_1b8 = 0; _w = (int)(in_stack_fffffffffffffb88 >> 0x20), local_1b8 < local_34;
          local_1b8 = local_1b8 + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_208);
        ncnn::Mat::~Mat((Mat *)0x4bca1d);
        local_1c0 = pfVar3;
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_258);
        ncnn::Mat::~Mat((Mat *)0x4bca69);
        local_210 = pfVar3;
        pfVar3 = ncnn::Mat::operator[](&local_90,(long)local_1b8);
        local_25c = *pfVar3 / (float)local_44;
        for (local_260 = 0; local_260 < local_44; local_260 = local_260 + 1) {
          local_210[local_260] = local_1c0[local_260] - local_25c;
        }
      }
    }
    else {
      local_104 = 0.0;
      for (local_108 = 0; local_108 < local_34; local_108 = local_108 + 1) {
        pfVar3 = ncnn::Mat::operator[](&local_90,(long)local_108);
        local_104 = *pfVar3 + local_104;
      }
      local_104 = local_104 / (float)(local_34 * local_44);
      for (local_10c = 0; _w = (int)(in_stack_fffffffffffffb88 >> 0x20), local_10c < local_34;
          local_10c = local_10c + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_160);
        ncnn::Mat::~Mat((Mat *)0x4bc898);
        local_118 = pfVar3;
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
        pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1b0);
        ncnn::Mat::~Mat((Mat *)0x4bc8e4);
        for (local_1b4 = 0; local_1b4 < local_44; local_1b4 = local_1b4 + 1) {
          pfVar3[local_1b4] = local_118[local_1b4] - local_104;
        }
        local_168 = pfVar3;
      }
    }
    if (*(int *)(in_RDI + 0xd0) != 0) {
      ncnn::Mat::Mat(in_stack_fffffffffffffb90,_w,(size_t)in_stack_fffffffffffffb80,
                     (Allocator *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffb80);
      if (bVar2) {
        local_4 = -100;
        local_a0 = 1;
      }
      else {
        for (local_2ac = 0; local_2ac < local_34; local_2ac = local_2ac + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                             (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_300);
          ncnn::Mat::~Mat((Mat *)0x4bcc6a);
          local_304 = 0.0;
          for (local_308 = 0; local_308 < local_44; local_308 = local_308 + 1) {
            local_304 = pfVar3[local_308] * pfVar3[local_308] + local_304;
          }
          in_stack_fffffffffffffbac = local_304;
          local_2b8 = pfVar3;
          pfVar3 = ncnn::Mat::operator[](&local_2a8,(long)local_2ac);
          *pfVar3 = in_stack_fffffffffffffbac;
        }
        if (*(int *)(in_RDI + 0xd4) == 0) {
          for (local_378 = 0; local_378 < local_34; local_378 = local_378 + 1) {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                               (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
            pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_3c8);
            ncnn::Mat::~Mat((Mat *)0x4bcfd0);
            local_380 = pfVar3;
            pfVar3 = ncnn::Mat::operator[](&local_2a8,(long)local_378);
            dVar4 = std::sqrt((double)(ulong)(uint)(*pfVar3 / (float)local_44));
            fVar1 = *(float *)(in_RDI + 0xd8);
            for (local_3d8 = 0; local_3d8 < local_44; local_3d8 = local_3d8 + 1) {
              local_380[local_3d8] = local_380[local_3d8] * (1.0 / (SUB84(dVar4,0) + fVar1));
            }
          }
        }
        else {
          local_30c = 0.0;
          for (local_310 = 0; local_310 < local_34; local_310 = local_310 + 1) {
            in_stack_fffffffffffffba0 = (Mat *)ncnn::Mat::operator[](&local_2a8,(long)local_310);
            local_30c = *(float *)&in_stack_fffffffffffffba0->data + local_30c;
          }
          local_30c = local_30c / (float)(local_34 * local_44);
          dVar4 = std::sqrt((double)(ulong)(uint)local_30c);
          local_314 = SUB84(dVar4,0) + *(float *)(in_RDI + 0xd8);
          local_318 = 1.0 / local_314;
          for (local_31c = 0; local_31c < local_34; local_31c = local_31c + 1) {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                               (int)((ulong)in_stack_fffffffffffffba0 >> 0x20));
            pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_370);
            ncnn::Mat::~Mat((Mat *)0x4bcec1);
            for (local_374 = 0; local_374 < local_44; local_374 = local_374 + 1) {
              pfVar3[local_374] = pfVar3[local_374] * local_318;
            }
            local_328 = pfVar3;
          }
        }
        local_a0 = 0;
      }
      ncnn::Mat::~Mat((Mat *)0x4bd11d);
      if (local_a0 != 0) goto LAB_004bd151;
    }
    local_4 = 0;
    local_a0 = 1;
  }
LAB_004bd151:
  ncnn::Mat::~Mat((Mat *)0x4bd15e);
  return local_4;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i = 0; i < size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q = 0; q < channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i = 0; i < size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q = 0; q < channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
    }

    return 0;
}